

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O2

bit_array_impl * __thiscall
baryonyx::bit_array_impl::operator=(bit_array_impl *this,bit_array_impl *other)

{
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> __p;
  int __n2;
  uint uVar1;
  uint uVar2;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> local_20;
  
  if (this == other) {
    return this;
  }
  if (this->m_size == other->m_size) {
    uVar1 = this->m_block_size;
    uVar2 = other->m_block_size;
    if (uVar1 == uVar2) goto LAB_00128d15;
  }
  else {
    uVar2 = other->m_block_size;
  }
  this->m_size = other->m_size;
  this->m_block_size = uVar2;
  std::make_unique<unsigned_long[]>((size_t)&local_20);
  __p._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       local_20._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  local_20._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0;
  std::__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>::reset
            ((__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> *)&this->m_data,
             (pointer)__p._M_t.
                      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                      .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)&local_20);
  uVar1 = this->m_block_size;
LAB_00128d15:
  if (0 < (int)uVar1) {
    memmove((this->m_data)._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,
            (other->m_data)._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,(ulong)uVar1 << 3);
  }
  return this;
}

Assistant:

bit_array_impl& operator=(const bit_array_impl& other)
    {
        if (this != &other) {
            if (!(m_size == other.m_size &&
                  m_block_size == other.m_block_size)) {
                m_size = other.m_size;
                m_block_size = other.m_block_size;
                m_data = std::make_unique<underlying_type[]>(m_block_size);
            }
            std::copy_n(other.m_data.get(), m_block_size, m_data.get());
        }

        return *this;
    }